

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O3

string * vimEditCommand(string *__return_storage_ptr__,string *path,
                       optional<std::pair<int,_int>_> location,string *vimArgs)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_04;
  string *extraout_RAX_05;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str_2;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  string line;
  string col;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [32];
  size_type *local_b0;
  size_type local_a8;
  size_type local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "eval \'$EDITOR ",vimArgs);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                      "\\\"");
  local_f0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == paVar8) {
    local_f0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_f0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_f0,(path->_M_dataplus)._M_p,path->_M_string_length);
  local_110._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == paVar8) {
    local_110.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_110._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_110,"\\\"");
  local_b0 = &local_a0;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar8) {
    local_a0 = paVar8->_M_allocated_capacity;
    uStack_98 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_a0 = paVar8->_M_allocated_capacity;
    local_b0 = psVar1;
  }
  local_a8 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (((undefined1  [12])
       location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
       super__Optional_payload_base<std::pair<int,_int>_> & (undefined1  [12])0x1) ==
      (undefined1  [12])0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_b0,(pointer)(local_a8 + (long)local_b0));
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (__return_storage_ptr__,"\'");
  }
  else {
    uVar11 = location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
             super__Optional_payload_base<std::pair<int,_int>_>._M_payload._0_4_;
    uVar10 = -uVar11;
    if (0 < (int)uVar11) {
      uVar10 = uVar11;
    }
    uVar11 = 1;
    uVar12 = 1;
    if (9 < uVar10) {
      uVar9 = (ulong)uVar10;
      uVar4 = 4;
      do {
        uVar12 = uVar4;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_00105a21;
        }
        if (uVar7 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_00105a21;
        }
        if (uVar7 < 10000) goto LAB_00105a21;
        uVar9 = uVar9 / 10000;
        uVar4 = uVar12 + 4;
      } while (99999 < uVar7);
      uVar12 = uVar12 + 1;
    }
LAB_00105a21:
    uVar9 = (ulong)location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
                   super__Optional_payload_base<std::pair<int,_int>_>._M_payload >> 0x1f & 1;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_110,(ulong)((int)uVar9 + uVar12),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_110._M_dataplus._M_p + uVar9,uVar12,uVar10);
    uVar12 = location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
             super__Optional_payload_base<std::pair<int,_int>_>._M_payload._4_4_;
    uVar10 = -uVar12;
    if (0 < (int)uVar12) {
      uVar10 = uVar12;
    }
    if (9 < uVar10) {
      uVar9 = (ulong)uVar10;
      uVar4 = 4;
      do {
        uVar11 = uVar4;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00105aaf;
        }
        if (uVar7 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00105aaf;
        }
        if (uVar7 < 10000) goto LAB_00105aaf;
        uVar9 = uVar9 / 10000;
        uVar4 = uVar11 + 4;
      } while (99999 < uVar7);
      uVar11 = uVar11 + 1;
    }
LAB_00105aaf:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_f0,(ulong)(uVar11 + -((int)uVar12 >> 0x1f)),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_f0._M_dataplus._M_p + (uint)-((int)uVar12 >> 0x1f),uVar11,uVar10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_b0,(pointer)(local_a8 + (long)local_b0));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_50," \\\"+call cursor(");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_50,local_110._M_dataplus._M_p,local_110._M_string_length);
    local_90._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar8 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar8) {
      local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,", ");
    local_70._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar8 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar8) {
      local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_70._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_70,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    local_d0._0_8_ = local_d0 + 0x10;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pbVar6->_M_dataplus)._M_p;
    paVar8 = &pbVar6->field_2;
    if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar8) {
      local_d0._16_8_ = paVar8->_M_allocated_capacity;
      local_d0._24_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_d0._16_8_ = paVar8->_M_allocated_capacity;
      local_d0._0_8_ = pbVar5;
    }
    local_d0._8_8_ = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_d0,")\\\"\'");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pbVar5->_M_dataplus)._M_p;
    paVar8 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar8) {
      uVar3 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d0 + 0x10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ !=
        pbVar5) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      pbVar5 = extraout_RAX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      pbVar5 = extraout_RAX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      pbVar5 = extraout_RAX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pbVar5 = extraout_RAX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      pbVar5 = extraout_RAX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      pbVar5 = extraout_RAX_04;
    }
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
    pbVar5 = extraout_RAX_05;
  }
  return pbVar5;
}

Assistant:

[[nodiscard]] static std::string
vimEditCommand(const std::string &path,
               std::optional<std::pair<int, int>> location,
               const std::string &vimArgs = "") {
  const std::string prefix =
      "eval '$EDITOR " + vimArgs + "\\\"" + path + "\\\"";
  if (location) {
    let line = std::to_string(std::get<0>(*location));
    let col = std::to_string(std::get<1>(*location));
    return prefix + " \\\"+call cursor(" + line + ", " + col + ")\\\"'";
  }

  return prefix + "'";
}